

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O2

void __thiscall
loader::Logger::Logger
          (Logger *this,string *logger_name,Console out,string *log_level,bool logging_enabled_env,
          string *format)

{
  logger *this_00;
  undefined3 in_register_00000081;
  shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_> sink;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_78 [16];
  string local_68;
  string local_48;
  
  this->log_to_console = true;
  this->logging_enabled = false;
  (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (CONCAT31(in_register_00000081,logging_enabled_env) != 0) {
    this->logging_enabled = true;
    if (out == out_stderr) {
      std::make_shared<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>();
      std::
      make_shared<spdlog::logger,std::__cxx11::string&,std::shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (shared_ptr<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_mutex>_>
                  *)logger_name);
    }
    else {
      if (out != out_stdout) {
        std::operator<<((ostream *)&std::cerr,"Invalid console output specified\n");
        this->logging_enabled = false;
        return;
      }
      std::make_shared<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>();
      std::
      make_shared<spdlog::logger,std::__cxx11::string&,std::shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 (shared_ptr<spdlog::sinks::ansicolor_stdout_sink<spdlog::details::console_mutex>_>
                  *)logger_name);
    }
    std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
    if (format->_M_string_length != 0) {
      this_00 = (this->_logger).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      std::__cxx11::string::string((string *)&local_48,(string *)format);
      spdlog::logger::set_pattern(this_00,&local_48,local);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::string((string *)(local_78 + 0x10),(string *)log_level);
    setLogLevel(this,(string *)(local_78 + 0x10));
    std::__cxx11::string::~string((string *)(local_78 + 0x10));
  }
  return;
}

Assistant:

Logger(std::string logger_name, Console out, std::string log_level, bool logging_enabled_env, std::string format = "") {
    if (logging_enabled_env) {
      logging_enabled = logging_enabled_env;
      try {
        if (out == Console::out_stdout) {
          auto sink = std::make_shared<spdlog::sinks::ansicolor_stdout_sink_mt>();
          _logger = std::make_shared<spdlog::logger>(logger_name, std::move(sink));
        } else if (out == Console::out_stderr) {
          auto sink = std::make_shared<spdlog::sinks::ansicolor_stderr_sink_mt>();
          _logger = std::make_shared<spdlog::logger>(logger_name, std::move(sink));
        } else {
          std::cerr << "Invalid console output specified\n";
          logging_enabled = false;
          return;
        }
      } catch (spdlog::spdlog_ex &exception) {
        std::cerr << "Unable to create log stdout logger " << exception.what() << "\n";
        logging_enabled = false;
        return;
      }

      if (!format.empty()) {
        _logger->set_pattern(format);
      }

      setLogLevel(log_level);
    }
  }